

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

uint IlmThread_3_4::ThreadPool::estimateThreadCountForFileIO(void)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint rv;
  uint local_4;
  
  uVar1 = std::thread::hardware_concurrency();
  if ((uVar1 != 0) && (uVar2 = std::numeric_limits<int>::max(), uVar1 <= uVar2)) {
    return uVar1;
  }
  lVar3 = sysconf(0x54);
  local_4 = (uint)lVar3;
  return local_4;
}

Assistant:

unsigned
ThreadPool::estimateThreadCountForFileIO ()
{
#ifdef ENABLE_THREADING
#    if ILMTHREAD_USE_TBB
    return tbb::this_task_arena::max_concurrency ();
#    else
    unsigned rv = std::thread::hardware_concurrency ();
    // hardware concurrency is not required to work
    if (rv == 0 ||
        rv > static_cast<unsigned> (std::numeric_limits<int>::max ()))
    {
        rv = 1;
#        if (defined(_WIN32) || defined(_WIN64))
        SYSTEM_INFO si;
        GetNativeSystemInfo (&si);

        rv = si.dwNumberOfProcessors;
#        else
        // linux, bsd, and mac are fine with this
        // other *nix should be too, right?
        rv = sysconf (_SC_NPROCESSORS_ONLN);
#        endif
    }
    return rv;
#    endif
#else
    return 0;
#endif
}